

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memorypool.h
# Opt level: O0

void __thiscall
despot::MemoryPool<despot::NavigationState>::NewChunk(MemoryPool<despot::NavigationState> *this)

{
  Chunk *this_00;
  NavigationState *local_30;
  int local_28;
  int i;
  Chunk *local_18;
  Chunk *chunk;
  MemoryPool<despot::NavigationState> *this_local;
  
  chunk = (Chunk *)this;
  this_00 = (Chunk *)operator_new(0x2000);
  Chunk::Chunk(this_00);
  local_18 = this_00;
  std::
  vector<despot::MemoryPool<despot::NavigationState>::Chunk_*,_std::allocator<despot::MemoryPool<despot::NavigationState>::Chunk_*>_>
  ::push_back(&this->chunks_,&local_18);
  for (local_28 = 0xff; -1 < local_28; local_28 = local_28 + -1) {
    local_30 = local_18->Objects + local_28;
    std::vector<despot::NavigationState_*,_std::allocator<despot::NavigationState_*>_>::push_back
              (&this->freelist_,&local_30);
    MemoryObject::ClearAllocated((MemoryObject *)&local_18->Objects[local_28].field_0x8);
  }
  return;
}

Assistant:

void NewChunk() {
		Chunk* chunk = new Chunk;
		chunks_.push_back(chunk);
		for (int i = Chunk::Size - 1; i >= 0; --i) {
			freelist_.push_back(&chunk->Objects[i]);
			chunk->Objects[i].ClearAllocated();
		}
	}